

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkBitsText_TestShell::~TEST_TestHarness_c_checkBitsText_TestShell
          (TEST_TestHarness_c_checkBitsText_TestShell *this)

{
  TEST_TestHarness_c_checkBitsText_TestShell *this_local;
  
  ~TEST_TestHarness_c_checkBitsText_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestHarness_c, checkBitsText)
{
    CHECK_EQUAL_C_BITS_TEXT(0xABCD, (unsigned short)0xABCD, 0xFFFF, "Text");
    fixture->setTestFunction(failBitsTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <00000000 00000001>\n\tbut was  <00000000 00000011>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: BitsTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}